

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *rhs,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator,bool copyConstStrings)

{
  Type TVar1;
  void *pvVar2;
  undefined1 in_CL;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDX;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RSI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_RDI;
  SizeType i_1;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *re;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *le;
  SizeType count_1;
  SizeType i;
  Member *rm;
  Member *lm;
  SizeType count;
  undefined4 in_stack_ffffffffffffff68;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff70;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar3;
  uint local_64;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar4;
  undefined3 in_stack_ffffffffffffffb4;
  uint uVar5;
  
  uVar5 = CONCAT13(in_CL,in_stack_ffffffffffffffb4) & 0x1ffffff;
  TVar1 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetType(in_RSI);
  if (TVar1 == kObjectType) {
    uVar4 = (in_RSI->data_).s.length;
    pvVar2 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                       (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    for (local_64 = 0; local_64 < uVar4; local_64 = local_64 + 1) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (in_RSI,in_RDX,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)CONCAT44(uVar5,uVar4)
                 ,SUB81((ulong)pvVar2 >> 0x38,0));
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (in_RSI,in_RDX,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)CONCAT44(uVar5,uVar4)
                 ,SUB81((ulong)pvVar2 >> 0x38,0));
    }
    (in_RDI->data_).f.flags = 3;
    (in_RDI->data_).s.hashcode = uVar4;
    (in_RDI->data_).s.length = uVar4;
    (in_RDI->data_).s.str =
         (Ch *)((ulong)(in_RDI->data_).s.str & 0xffff000000000000 | (ulong)pvVar2);
  }
  else if (TVar1 == kArrayType) {
    uVar4 = (in_RSI->data_).s.length;
    pvVar2 = MemoryPoolAllocator<rapidjson::CrtAllocator>::Malloc
                       (in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
    for (uVar3 = 0; uVar3 < uVar4; uVar3 = uVar3 + 1) {
      GenericValue<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (in_RSI,in_RDX,
                 (MemoryPoolAllocator<rapidjson::CrtAllocator> *)
                 CONCAT44(uVar5,in_stack_ffffffffffffffb0),
                 SUB81((ulong)in_stack_ffffffffffffffa8 >> 0x38,0));
    }
    (in_RDI->data_).f.flags = 4;
    (in_RDI->data_).s.hashcode = uVar4;
    (in_RDI->data_).s.length = uVar4;
    (in_RDI->data_).s.str =
         (Ch *)((ulong)(in_RDI->data_).s.str & 0xffff000000000000 | (ulong)pvVar2);
  }
  else if (TVar1 == kStringType) {
    if (((in_RSI->data_).f.flags == 0x405) && ((uVar5 & 0x1000000) == 0)) {
      (in_RDI->data_).f.flags = (in_RSI->data_).f.flags;
      (in_RDI->data_).n = (in_RSI->data_).n;
      (in_RDI->data_).s.str = (in_RSI->data_).s.str;
    }
    else {
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(in_RSI);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetStringLength(in_RDI);
      StringRef<char>((char *)CONCAT44(TVar1,in_stack_ffffffffffffff68),(size_t)in_RDI);
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::SetStringRaw((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                     (StringRefType *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    }
  }
  else {
    (in_RDI->data_).f.flags = (in_RSI->data_).f.flags;
    (in_RDI->data_).n = (in_RSI->data_).n;
    (in_RDI->data_).s.str = (in_RSI->data_).s.str;
  }
  return;
}

Assistant:

GenericValue(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings = false) {
        switch (rhs.GetType()) {
        case kObjectType: {
                SizeType count = rhs.data_.o.size;
                Member* lm = reinterpret_cast<Member*>(allocator.Malloc(count * sizeof(Member)));
                const typename GenericValue<Encoding,SourceAllocator>::Member* rm = rhs.GetMembersPointer();
                for (SizeType i = 0; i < count; i++) {
                    new (&lm[i].name) GenericValue(rm[i].name, allocator, copyConstStrings);
                    new (&lm[i].value) GenericValue(rm[i].value, allocator, copyConstStrings);
                }
                data_.f.flags = kObjectFlag;
                data_.o.size = data_.o.capacity = count;
                SetMembersPointer(lm);
            }
            break;
        case kArrayType: {
                SizeType count = rhs.data_.a.size;
                GenericValue* le = reinterpret_cast<GenericValue*>(allocator.Malloc(count * sizeof(GenericValue)));
                const GenericValue<Encoding,SourceAllocator>* re = rhs.GetElementsPointer();
                for (SizeType i = 0; i < count; i++)
                    new (&le[i]) GenericValue(re[i], allocator, copyConstStrings);
                data_.f.flags = kArrayFlag;
                data_.a.size = data_.a.capacity = count;
                SetElementsPointer(le);
            }
            break;
        case kStringType:
            if (rhs.data_.f.flags == kConstStringFlag && !copyConstStrings) {
                data_.f.flags = rhs.data_.f.flags;
                data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            }
            else
                SetStringRaw(StringRef(rhs.GetString(), rhs.GetStringLength()), allocator);
            break;
        default:
            data_.f.flags = rhs.data_.f.flags;
            data_  = *reinterpret_cast<const Data*>(&rhs.data_);
            break;
        }
    }